

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinEPC18_1>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps,
               host_buffer_type vxc)

{
  double *eps_00;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  double e;
  double v_b;
  double v_a;
  host_buffer_type vxc_i;
  const_host_buffer_type rho_i;
  int32_t i;
  double local_58;
  double *in_stack_ffffffffffffffb0;
  double *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    eps_00 = (double *)(in_RCX + (long)(iVar1 << 1) * 8);
    lda_screening_interface<ExchCXX::BuiltinEPC18_1>::eval_exc_vxc_polar
              ((double)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
               (double)(in_RSI + (long)(iVar1 << 1) * 8),eps_00,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    *(double *)(in_RDX + (long)iVar1 * 8) =
         in_XMM0_Qa * local_58 + *(double *)(in_RDX + (long)iVar1 * 8);
    *eps_00 = in_XMM0_Qa * (double)in_stack_ffffffffffffffb8 + *eps_00;
    eps_00[1] = in_XMM0_Qa * (double)in_stack_ffffffffffffffb0 + eps_00[1];
  }
  return;
}

Assistant:

LDA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto rho_i = rho + 2*i;
    auto vxc_i = vxc + 2*i;

    double v_a, v_b, e;
    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], e, v_a, v_b);
    eps[i]   += scal_fact * e;
    vxc_i[0] += scal_fact * v_a;
    vxc_i[1] += scal_fact * v_b;

  }

}